

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::~QArrayDataPointer
          (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *this)

{
  Data *pDVar1;
  ButtonInfo *this_00;
  long lVar2;
  
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      if (this->size != 0) {
        this_00 = this->ptr;
        lVar2 = this->size * 0x98;
        do {
          QRenderRule::~QRenderRule(&this_00->rule);
          this_00 = this_00 + 1;
          lVar2 = lVar2 + -0x98;
        } while (lVar2 != 0);
      }
      QArrayData::deallocate(&this->d->super_QArrayData,0x98,0x10);
      return;
    }
  }
  return;
}

Assistant:

~QArrayDataPointer()
    {
        if (!deref()) {
            (*this)->destroyAll();
            Data::deallocate(d);
        }
    }